

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall
pfederc::TypeExpr::TypeExpr
          (TypeExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *tokId,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr)

{
  Expr *pEVar1;
  size_t sVar2;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_TYPE;
  sVar2 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar2;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Capable).caps._M_t.
  super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
  super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl =
       (caps->_M_t).
       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>.
       _M_t.
       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
       super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
  (caps->_M_t).
  super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
  super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl = (Capabilities *)0x0;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TypeExpr_0012b8a0;
  this->tokId = tokId;
  (this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  if (this->tokId == (Token *)0x0) {
    __assert_fail("this->tokId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x22b,
                  "pfederc::TypeExpr::TypeExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, std::unique_ptr<Expr> &&)"
                 );
  }
  pEVar1 = (this->expr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1 != (Expr *)0x0) {
    pEVar1->parent = &this->super_Expr;
    return;
  }
  __assert_fail("!!this->expr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x22c,
                "pfederc::TypeExpr::TypeExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, std::unique_ptr<Expr> &&)"
               );
}

Assistant:

TypeExpr::TypeExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *tokId, std::unique_ptr<Expr> &&expr) noexcept
  : Expr(lexer, ExprType::EXPR_TYPE, pos), Capable(std::move(caps)),
    tokId{tokId}, expr(std::move(expr)) {
  assert(this->tokId);
  assert(!!this->expr);

  this->expr->setParent(this);
}